

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.h
# Opt level: O3

void a__GLTexureUpload3D(AGLTexture *tex,AGLTextureData *data,GLenum binding,A__GLTextureFormat tf)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  void *pvVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  
  iVar1 = data->x;
  iVar2 = data->y;
  iVar7 = data->width + iVar1;
  iVar8 = data->height + iVar2;
  iVar3 = data->z;
  iVar6 = data->depth + iVar3;
  bVar9 = true;
  if ((iVar7 <= tex->width) && (iVar8 <= tex->height)) {
    bVar9 = tex->depth < iVar6;
  }
  if (iVar3 < 1 && (iVar2 < 1 && iVar1 < 1)) {
    pvVar5 = data->pixels;
  }
  else {
    pvVar5 = (void *)0x0;
  }
  uVar4 = tf._0_8_ >> 0x20;
  if ((binding != 0x806f) && (binding != 0x8c1a)) {
    aAppDebugPrintf("ERROR @ %s:%d: (%s) failed",
                    "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h"
                    ,0x418,"binding == GL_TEXTURE_3D || binding == GL_TEXTURE_2D_ARRAY");
    aAppTerminate(-1);
  }
  if (!(bool)(~bVar9 & pvVar5 == (void *)0x0)) {
    glTexImage3D(binding,0,tf._0_8_ & 0xffffffff,iVar7,iVar8,iVar6,0,uVar4,tf.type,pvVar5);
    tex->width = iVar7;
    tex->height = iVar8;
    tex->depth = iVar6;
  }
  if (iVar3 >= 1 || (iVar2 >= 1 || iVar1 >= 1)) {
    pvVar5 = data->pixels;
    if (pvVar5 == (void *)0x0) {
      aAppDebugPrintf("ERROR @ %s:%d: (%s) failed",
                      "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h"
                      ,0x425,"data->pixels");
      aAppTerminate(-1);
      pvVar5 = data->pixels;
    }
    glTexSubImage3D(binding,0,data->x,data->y,data->z,data->width,data->height,data->depth,uVar4,
                    tf.type,pvVar5);
  }
  return;
}

Assistant:

static void a__GLTexureUpload3D(AGLTexture *tex, const AGLTextureData *data, GLenum binding, struct A__GLTextureFormat tf) {
	const int maxwidth = data->x + data->width;
	const int maxheight = data->y + data->height;
	const int maxdepth = data->z + data->depth;

	const int expand = (maxwidth > tex->width)
		|| (maxheight > tex->height)
		|| (maxdepth > tex->depth);
	const int is_subimage = (data->x > 0 || data->y > 0 || data->z > 0);
	const void *const to_upload = (!is_subimage && data->pixels) ? data->pixels : NULL;

	ATTO_ASSERT(binding == GL_TEXTURE_3D || binding == GL_TEXTURE_2D_ARRAY);

	if (expand || to_upload) {
		AGL__CALL(glTexImage3D(binding, 0, tf.internal,
			maxwidth, maxheight, maxdepth, 0,
			tf.format, tf.type,
			to_upload));
		tex->width = maxwidth;
		tex->height = maxheight;
		tex->depth = maxdepth;
	}

	if (is_subimage) {
		ATTO_ASSERT(data->pixels);
		AGL__CALL(glTexSubImage3D(binding, 0,
			data->x, data->y, data->z, data->width, data->height, data->depth,
			tf.format, tf.type, data->pixels));
	}
}